

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_DataBlobSourceCreateParametersCreate(hrgls_DataBlobSourceCreateParams *returnParams)

{
  hrgls_DataBlobSourceCreateParams_ *this;
  hrgls_DataBlobSourceCreateParams ret;
  hrgls_Status s;
  hrgls_DataBlobSourceCreateParams *returnParams_local;
  
  this = (hrgls_DataBlobSourceCreateParams_ *)operator_new(0x30);
  hrgls_DataBlobSourceCreateParams_::hrgls_DataBlobSourceCreateParams_(this);
  *returnParams = this;
  return 0;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreateParametersCreate(
    hrgls_DataBlobSourceCreateParams *returnParams)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    hrgls_DataBlobSourceCreateParams ret;
    try {
      ret = new hrgls_DataBlobSourceCreateParams_;
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret = nullptr;
    }
    *returnParams = ret;
    return s;
  }